

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O3

void P_PoisonMobj(AActor *target,AActor *inflictor,AActor *source,int damage,int duration,int period
                 ,FName *type)

{
  uint uVar1;
  
  if (((((inflictor->flags6).Value & 0x4000000) != 0) || (((target->flags2).Value & 0x8000000) == 0)
      ) || ((target->player == (player_t *)0x0 && (((inflictor->flags3).Value & 0x2000000) != 0))))
  {
    (target->Poisoner).field_0.p = source;
    (target->PoisonDamageTypeReceived).super_FName.Index = type->Index;
    target->PoisonPeriodReceived = period;
    uVar1 = (inflictor->flags6).Value;
    if ((uVar1 >> 0x14 & 1) != 0) {
      damage = damage + target->PoisonDamageReceived;
    }
    target->PoisonDamageReceived = damage;
    if ((uVar1 >> 0x15 & 1) != 0) {
      duration = duration + target->PoisonDurationReceived;
    }
    target->PoisonDurationReceived = duration;
  }
  return;
}

Assistant:

void P_PoisonMobj (AActor *target, AActor *inflictor, AActor *source, int damage, int duration, int period, FName type)
{
	// Check for invulnerability.
	if (!(inflictor->flags6 & MF6_POISONALWAYS))
	{
		if (target->flags2 & MF2_INVULNERABLE)
		{ // actor is invulnerable
			if (target->player == NULL)
			{
				if (!(inflictor->flags3 & MF3_FOILINVUL))
				{
					return;
				}
			}
			else
			{
				return;
			}
		}
	}

	target->Poisoner = source;
	target->PoisonDamageTypeReceived = type;
	target->PoisonPeriodReceived = period;

	if (inflictor->flags6 & MF6_ADDITIVEPOISONDAMAGE)
	{
		target->PoisonDamageReceived += damage;
	}
	else
	{
		target->PoisonDamageReceived = damage;
	}

	if (inflictor->flags6 & MF6_ADDITIVEPOISONDURATION)
	{
		target->PoisonDurationReceived += duration;
	}
	else
	{
		target->PoisonDurationReceived = duration;
	}

}